

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

void crnlib::
     hash_map<crnlib::vec<16U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<16U,_float>_>,_crnlib::equal_to<crnlib::vec<16U,_float>_>_>
     ::move_node(node *pDst,node *pSrc)

{
  void *in_RSI;
  void *in_RDI;
  
  memcpy(in_RDI,in_RSI,0x48);
  *(undefined1 *)((long)in_RSI + 0x44) = 0;
  return;
}

Assistant:

static inline void move_node(node* pDst, node* pSrc) {
    CRNLIB_ASSERT(!pDst->state);

    if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key) && CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value)) {
      memcpy(pDst, pSrc, sizeof(node));
    } else {
      if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Key))
        memcpy(&pDst->first, &pSrc->first, sizeof(Key));
      else {
        scalar_type<Key>::construct(&pDst->first, pSrc->first);
        scalar_type<Key>::destruct(&pSrc->first);
      }

      if (CRNLIB_IS_BITWISE_COPYABLE_OR_MOVABLE(Value))
        memcpy(&pDst->second, &pSrc->second, sizeof(Value));
      else {
        scalar_type<Value>::construct(&pDst->second, pSrc->second);
        scalar_type<Value>::destruct(&pSrc->second);
      }

      pDst->state = cStateValid;
    }

    pSrc->state = cStateInvalid;
  }